

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObject.cpp
# Opt level: O3

void __thiscall PDFObject::SetMetadata(PDFObject *this,string *inKey,IDeletable *inValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  IDeletable *pIVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDeletable_*>
  local_48;
  
  pIVar3 = DetachMetadata(this,inKey);
  if (pIVar3 != (IDeletable *)0x0) {
    (**pIVar3->_vptr_IDeletable)(pIVar3);
  }
  paVar1 = &local_48.first.field_2;
  pcVar2 = (inKey->_M_dataplus)._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + inKey->_M_string_length);
  local_48.second = inValue;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDeletable*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDeletable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDeletable*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,IDeletable*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDeletable*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDeletable*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDeletable*>>>
              *)&this->mMetadata,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void PDFObject::SetMetadata(const std::string& inKey, IDeletable* inValue) {
	// delete old metadata
	DeleteMetadata(inKey);

	mMetadata.insert(StringToIDeletable::value_type(inKey, inValue));
}